

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O0

long __thiscall mkvparser::BlockGroup::Parse(BlockGroup *this)

{
  bool local_29;
  long status;
  BlockGroup *this_local;
  
  this_local = (BlockGroup *)Block::Parse(&this->m_block,(this->super_BlockEntry).m_pCluster);
  if (this_local == (BlockGroup *)0x0) {
    local_29 = false;
    if (0 < this->m_prev) {
      local_29 = this->m_next < 1;
    }
    Block::SetKey(&this->m_block,local_29);
    this_local = (BlockGroup *)0x0;
  }
  return (long)this_local;
}

Assistant:

long BlockGroup::Parse() {
  const long status = m_block.Parse(m_pCluster);

  if (status)
    return status;

  m_block.SetKey((m_prev > 0) && (m_next <= 0));

  return 0;
}